

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

int Aig_ConeCountAndMark_rec(Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  int Counter;
  Aig_Obj_t *pObj_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                  ,0x29d,"int Aig_ConeCountAndMark_rec(Aig_Obj_t *)");
  }
  iVar1 = Aig_ObjIsNode(pObj);
  if ((iVar1 != 0) && (iVar1 = Aig_ObjIsMarkA(pObj), iVar1 == 0)) {
    pAVar4 = Aig_ObjFanin0(pObj);
    iVar1 = Aig_ConeCountAndMark_rec(pAVar4);
    pAVar4 = Aig_ObjFanin1(pObj);
    iVar2 = Aig_ConeCountAndMark_rec(pAVar4);
    iVar3 = Aig_ObjIsMarkA(pObj);
    if (iVar3 == 0) {
      Aig_ObjSetMarkA(pObj);
      return iVar1 + 1 + iVar2;
    }
    __assert_fail("!Aig_ObjIsMarkA(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDfs.c"
                  ,0x2a2,"int Aig_ConeCountAndMark_rec(Aig_Obj_t *)");
  }
  return 0;
}

Assistant:

int Aig_ConeCountAndMark_rec( Aig_Obj_t * pObj )
{
    int Counter;
    assert( !Aig_IsComplement(pObj) );
    if ( !Aig_ObjIsNode(pObj) || Aig_ObjIsMarkA(pObj) )
        return 0;
    Counter = 1 + Aig_ConeCountAndMark_rec( Aig_ObjFanin0(pObj) ) + 
        Aig_ConeCountAndMark_rec( Aig_ObjFanin1(pObj) );
    assert( !Aig_ObjIsMarkA(pObj) ); // loop detection
    Aig_ObjSetMarkA( pObj );
    return Counter;
}